

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

uint ON_Font::RichTextPropertyDeviation
               (bool bPreferedRtfBold,bool bPreferedItalic,bool bPreferedUnderline,
               bool bPreferedStrikethrough,bool bAvailableRtfBold,bool bAvailableItalic,
               bool bAvailableUnderline,bool bAvailableStrikethrough)

{
  uint uVar1;
  uint uVar2;
  undefined1 local_2d;
  undefined1 local_2b;
  undefined1 local_29;
  undefined1 local_1d;
  uint us_dev;
  uint wss_dev;
  Style available_style;
  Style prefered_style;
  Weight available_weight;
  Weight prefered_weight;
  bool bAvailableStrikethrough_local;
  bool bAvailableUnderline_local;
  bool bAvailableItalic_local;
  bool bAvailableRtfBold_local;
  bool bPreferedStrikethrough_local;
  bool bPreferedUnderline_local;
  bool bPreferedItalic_local;
  bool bPreferedRtfBold_local;
  
  local_1d = Bold;
  if (!bPreferedRtfBold) {
    local_1d = Normal;
  }
  local_29 = Bold;
  if (!bAvailableRtfBold) {
    local_29 = Normal;
  }
  local_2b = Italic;
  if (!bPreferedItalic) {
    local_2b = Upright;
  }
  local_2d = Italic;
  if (!bPreferedItalic) {
    local_2d = Upright;
  }
  uVar1 = WeightStretchStyleDeviation(local_1d,Medium,local_2b,local_29,Medium,local_2d);
  uVar2 = UnderlinedStrikethroughDeviation
                    (bPreferedUnderline,bPreferedStrikethrough,bAvailableUnderline,
                     bAvailableStrikethrough);
  return uVar1 + uVar2;
}

Assistant:

unsigned int ON_Font::RichTextPropertyDeviation(
    bool bPreferedRtfBold,
    bool bPreferedItalic,
    bool bPreferedUnderline,
    bool bPreferedStrikethrough,
    bool bAvailableRtfBold,
    bool bAvailableItalic,
    bool bAvailableUnderline,
    bool bAvailableStrikethrough
)
{
  const ON_Font::Weight prefered_weight = bPreferedRtfBold ? ON_Font::Weight::Bold : ON_Font::Weight::Normal;
  const ON_Font::Weight available_weight = bAvailableRtfBold ? ON_Font::Weight::Bold : ON_Font::Weight::Normal;

  const ON_Font::Style prefered_style = bPreferedItalic ? ON_Font::Style::Italic : ON_Font::Style::Upright;
  const ON_Font::Style available_style = bPreferedItalic ? ON_Font::Style::Italic : ON_Font::Style::Upright;

  const unsigned int wss_dev = ON_Font::WeightStretchStyleDeviation(
    prefered_weight, ON_Font::Stretch::Medium, prefered_style,
    available_weight, ON_Font::Stretch::Medium, available_style
  );

  const unsigned int us_dev = ON_Font::UnderlinedStrikethroughDeviation(
    bPreferedUnderline,
    bPreferedStrikethrough,
    bAvailableUnderline,
    bAvailableStrikethrough
  );
  return wss_dev + us_dev;
}